

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O2

int SetUpDownOrientationPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,BOOL bUpOrientation)

{
  FILE *__s;
  int iVar1;
  size_t sVar2;
  char buf [32];
  
  sprintf(buf,"EU%d\r",(ulong)(bUpOrientation != 0));
  sVar2 = strlen(buf);
  iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)buf,(int)sVar2);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((pPathfinderDVL->bSaveRawData != 0) &&
       (__s = (FILE *)pPathfinderDVL->pfSaveFile, iVar1 = 0, __s != (FILE *)0x0)) {
      sVar2 = strlen(buf);
      fwrite(buf,sVar2,1,__s);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
  }
  else {
    puts("Error writing data to a PathfinderDVL. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int SetUpDownOrientationPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, BOOL bUpOrientation)
{
	char buf[MAX_NB_BYTES_COMMAND_PATHFINDERDVL];

	sprintf(buf, "EU%d\r", bUpOrientation? 1: 0);

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}